

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O2

bool ON_ClampKnotVector(int cv_dim,int order,int cv_count,int cv_stride,double *cv,double *knot,
                       int end)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  double *knots;
  
  if ((((1 < order) && (cv != (double *)0x0)) && (knot != (double *)0x0)) &&
     ((uint)end < 3 && order <= cv_count)) {
    bVar1 = true;
    if ((end & 1U) == 0) {
      uVar5 = (ulong)(order - 2);
      bVar1 = ON_EvaluateNurbsDeBoor(cv_dim,order,cv_stride,cv,knot,1,0.0,knot[uVar5]);
      if (bVar1) {
        for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
          knot[uVar4] = knot[uVar5];
        }
      }
      if (1 < end - 1U) {
        return bVar1;
      }
    }
    knots = knot + (cv_count - order);
    bVar2 = ON_EvaluateNurbsDeBoor
                      (cv_dim,order,cv_stride,cv + (cv_count - order) * cv_stride,knots,-1,0.0,
                       knots[(ulong)(uint)order - 1]);
    if (bVar2) {
      for (uVar3 = order * 2 - 3; order <= (int)uVar3; uVar3 = uVar3 - 1) {
        knots[uVar3] = knots[(ulong)(uint)order - 1];
      }
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool ON_ClampKnotVector(
        int cv_dim,   // dimension of cv's = ( = dim+1 for rational cvs )
        int order, 
        int cv_count,
        int cv_stride, 
        double* cv,   // nullptr or cv array with room for at least knot_multiplicity new cvs
        double* knot, // knot array with room for at least knot_multiplicity new knots
        int end       // 0 = clamp start, 1 = clamp end, 2 = clamp both ends
        )
{
  // sets initial/final order-2 knot values to match knot[order-2]/knot[cv_count-1]
  // Adjusts initial/final order many CVs so that the curve location is unchanged. 
  // Requires that knot[order-2]< knot[order-1] and/or knot[cv_count-2] < knot[cv_count-1] 
  // 17-June-2020 Improved error reporting.  
 bool rc = false;
  int i, i0;

  if (cv && knot && order >= 2 && cv_count >= order && end>=0 && end<=2 ) {
    rc = true;
    if ( end == 0 || end == 2 ) { 
      if (ON_EvaluateNurbsDeBoor(cv_dim, order, cv_stride, cv, knot, 1, 0.0, knot[order - 2]))
      {
        for (i = 0; i < order - 2; i++)
          knot[i] = knot[order - 2];
      }
      else
        rc = false;
    }
    if ( end == 1 || end == 2 ) {
      i0 = cv_count-order;
      knot += i0;
      cv += i0*cv_stride;
      if (ON_EvaluateNurbsDeBoor(cv_dim, order, cv_stride, cv, knot, -1, 0.0, knot[order - 1]))
      {
        i0 = order - 1;
        for (i = 2 * order - 3; i > i0; i--)
          knot[i] = knot[i0];
      }
      else
        rc = false;
    }
  }
  return rc;
}